

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

QList<QFontDatabase::WritingSystem> * QFontDatabase::writingSystems(QString *family)

{
  long lVar1;
  QtFontFamily *pQVar2;
  QString *in_RSI;
  QMutexLocker<QRecursiveMutex> *in_RDI;
  long in_FS_OFFSET;
  WritingSystem writingSystem;
  int x;
  QtFontFamily *f;
  QFontDatabasePrivate *d;
  QList<QFontDatabase::WritingSystem> *list;
  QString foundryName;
  QString familyName;
  QMutexLocker<QRecursiveMutex> locker;
  undefined4 in_stack_ffffffffffffff68;
  parameter_type in_stack_ffffffffffffff6c;
  QMutexLocker<QRecursiveMutex> *this;
  uint local_78;
  QString *in_stack_ffffffffffffffa0;
  FamilyRequestFlags flags;
  QMutexLocker<QRecursiveMutex> *name;
  QFontDatabasePrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  name = in_RDI;
  QString::QString((QString *)0x741581);
  this_00 = (QFontDatabasePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x7415af);
  parseFontName((QString *)name,in_RSI,in_stack_ffffffffffffffa0);
  flags = (FamilyRequestFlags)((ulong)in_RSI >> 0x20);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::operator()
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
              *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  QMutexLocker<QRecursiveMutex>::QMutexLocker
            (this,(QRecursiveMutex *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  QFontDatabasePrivate::ensureFontDatabase();
  in_RDI->m_mutex = (QRecursiveMutex *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->m_isLocked = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI[1].m_mutex = (QRecursiveMutex *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QFontDatabase::WritingSystem>::QList((QList<QFontDatabase::WritingSystem> *)0x741636);
  pQVar2 = QFontDatabasePrivate::family(this_00,(QString *)name,flags);
  if ((pQVar2 != (QtFontFamily *)0x0) && (pQVar2->count != 0)) {
    for (local_78 = 1; (int)local_78 < 0x22; local_78 = local_78 + 1) {
      if ((pQVar2->writingSystems[local_78] & 1) != 0) {
        QList<QFontDatabase::WritingSystem>::append
                  ((QList<QFontDatabase::WritingSystem> *)0x7416ac,in_stack_ffffffffffffff6c);
      }
    }
  }
  QMutexLocker<QRecursiveMutex>::~QMutexLocker(this);
  QString::~QString((QString *)0x7416f0);
  QString::~QString((QString *)0x7416fa);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QList<QFontDatabase::WritingSystem> *)this;
  }
  __stack_chk_fail();
}

Assistant:

QList<QFontDatabase::WritingSystem> QFontDatabase::writingSystems(const QString &family)
{
    QString familyName, foundryName;
    parseFontName(family, foundryName, familyName);

    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    QList<WritingSystem> list;
    QtFontFamily *f = d->family(familyName);
    if (!f || f->count == 0)
        return list;

    for (int x = Latin; x < WritingSystemsCount; ++x) {
        const WritingSystem writingSystem = WritingSystem(x);
        if (f->writingSystems[writingSystem] & QtFontFamily::Supported)
            list.append(writingSystem);
    }
    return list;
}